

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.hpp
# Opt level: O1

void __thiscall
Catch::SonarQubeReporter::SonarQubeReporter(SonarQubeReporter *this,ReporterConfig *config)

{
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       false;
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = false;
  (this->super_CumulativeReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__CumulativeReporterBase_001fa7c8;
  (this->super_CumulativeReporterBase).m_config = config->m_fullConfig;
  (this->super_CumulativeReporterBase).stream = config->m_stream;
  memset(&(this->super_CumulativeReporterBase).m_assertions,0,0xb0);
  (this->super_CumulativeReporterBase).super_IStreamingReporter._vptr_IStreamingReporter =
       (_func_int **)&PTR__SonarQubeReporter_001faa30;
  XmlWriter::XmlWriter(&this->xml,config->m_stream);
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.shouldRedirectStdOut =
       true;
  (this->super_CumulativeReporterBase).super_IStreamingReporter.m_preferences.
  shouldReportAllAssertions = true;
  return;
}

Assistant:

SonarQubeReporter(ReporterConfig const& config)
        : CumulativeReporterBase(config)
        , xml(config.stream()) {
            m_preferences.shouldRedirectStdOut = true;
            m_preferences.shouldReportAllAssertions = true;
        }